

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo1.cpp
# Opt level: O0

int256_t * primesum::pi_lmo1(int128_t x)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  ulong uVar6;
  reference pvVar7;
  ulong uVar8;
  int256_t *this;
  int256_t *in_RDX;
  ulong in_RSI;
  int256_t *in_RDI;
  bool bVar9;
  int256_t p2;
  int256_t phi;
  int128_t m;
  int64_t b;
  int64_t n;
  vector<int,_std::allocator<int>_> mu;
  vector<int,_std::allocator<int>_> lpf;
  vector<int,_std::allocator<int>_> primes;
  int256_t S2;
  int256_t S1;
  int64_t c;
  int64_t pi_y;
  int64_t y;
  int64_t in_stack_fffffffffffffd08;
  undefined8 in_stack_fffffffffffffd10;
  int iVar10;
  int256_t *in_stack_fffffffffffffd18;
  int256_t *in_stack_fffffffffffffd20;
  int256_t *in_stack_fffffffffffffd38;
  int256_t *other;
  int256_t *in_stack_fffffffffffffd40;
  int64_t in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd50;
  value_type in_stack_fffffffffffffd54;
  int256_t *in_stack_fffffffffffffd58;
  int256_t *piVar11;
  int64_t in_stack_fffffffffffffd78;
  int64_t in_stack_fffffffffffffd88;
  int64_t in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdc0 [16];
  int256_t *local_178;
  long local_170;
  size_type local_160;
  int in_stack_fffffffffffffed4;
  int64_t in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffee0 [16];
  size_type local_108;
  vector<int,_std::allocator<int>_> local_100;
  vector<int,_std::allocator<int>_> local_d8;
  vector<int,_std::allocator<int>_> local_c0;
  int256_t local_a8;
  int256_t local_88;
  size_type local_68;
  int64_t local_60;
  int256_t *local_58;
  int256_t *local_30;
  ulong local_28;
  int256_t *local_20;
  
  iVar10 = (int)((ulong)in_stack_fffffffffffffd10 >> 0x20);
  if (-(long)in_RDX < (long)(ulong)(1 < in_RSI)) {
    x_02._8_8_ = in_stack_fffffffffffffd78;
    x_02._0_8_ = in_RDI;
    piVar11 = in_RDI;
    local_28 = in_RSI;
    local_20 = in_RDX;
    local_58 = (int256_t *)iroot<3,__int128>((__int128)x_02);
    local_30 = local_58;
    local_60 = pi_legendre((int64_t)in_stack_fffffffffffffd18,iVar10);
    local_68 = PhiTiny::get_c(in_stack_fffffffffffffd08);
    int256_t::int256_t<int,void>(&local_88,0);
    int256_t::int256_t<int,void>(&local_a8,0);
    generate_primes(in_stack_fffffffffffffd48);
    generate_lpf(in_stack_fffffffffffffd78);
    generate_moebius(in_stack_fffffffffffffd78);
    for (local_108 = 1; local_160 = local_68, (long)local_108 <= (long)local_30;
        local_108 = local_108 + 1) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_d8,local_108);
      iVar10 = *pvVar7;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_c0,local_68);
      if (*pvVar7 < iVar10) {
        __divti3(local_28,local_20,local_108,(long)local_108 >> 0x3f);
        phi_sum((int128_t)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
        std::vector<int,_std::allocator<int>_>::operator[](&local_100,local_108);
        int256_t::operator*((int256_t *)
                            CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                            in_stack_fffffffffffffd48);
        int256_t::operator+=(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      }
    }
    while( true ) {
      iVar10 = (int)((ulong)in_stack_fffffffffffffd48 >> 0x20);
      local_160 = local_160 + 1;
      if (local_60 <= (long)local_160) break;
      in_stack_fffffffffffffd58 = local_30;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_c0,local_160);
      local_178 = (int256_t *)((long)in_stack_fffffffffffffd58 / (long)*pvVar7 + 1);
      for (local_170 = (long)local_178 >> 0x3f; lVar1 = ((long)local_30 >> 0x3f) - local_170,
          (SBORROW8((long)local_30 >> 0x3f,local_170) !=
          SBORROW8(lVar1,(ulong)(local_30 < local_178))) ==
          (long)(lVar1 - (ulong)(local_30 < local_178)) < 0; local_170 = local_170 + (ulong)bVar9) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_d8,(size_type)local_178);
        in_stack_fffffffffffffd54 = *pvVar7;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_c0,local_160);
        uVar6 = local_28;
        if (*pvVar7 < in_stack_fffffffffffffd54) {
          other = local_20;
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_c0,local_160);
          uVar8 = (ulong)*pvVar7;
          this = (int256_t *)((long)uVar8 >> 0x3f);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = uVar8;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = local_178;
          in_stack_fffffffffffffd48 = SUB168(auVar2 * auVar4,0);
          __divti3(uVar6,other,in_stack_fffffffffffffd48,
                   SUB168(auVar2 * auVar4,8) + uVar8 * local_170 + (long)this * (long)local_178);
          phi_sum((int128_t)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&local_100,(size_type)local_178);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = (long)*pvVar7;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = local_178;
          in_stack_fffffffffffffd20 = SUB168(auVar3 * auVar5,0);
          in_stack_fffffffffffffd18 = local_178;
          std::vector<int,_std::allocator<int>_>::operator[](&local_c0,local_160);
          x_00._4_4_ = in_stack_fffffffffffffd54;
          x_00._0_4_ = in_stack_fffffffffffffd50;
          x_00._8_8_ = in_stack_fffffffffffffd58;
          int256_t::operator*(in_RDI,(__int128)x_00);
          int256_t::operator-=(this,other);
        }
        bVar9 = (int256_t *)0xfffffffffffffffe < local_178;
        local_178 = (int256_t *)((long)&local_178->low + 1);
      }
    }
    int256_t::operator+(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    P2((int128_t)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
    prime_sum_tiny(in_stack_fffffffffffffd88);
    x_01._4_4_ = in_stack_fffffffffffffd54;
    x_01._0_4_ = in_stack_fffffffffffffd50;
    x_01._8_8_ = in_stack_fffffffffffffd58;
    int256_t::operator+(in_RDI,(__int128)x_01);
    int256_t::operator-((int256_t *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                        iVar10);
    int256_t::operator-(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd20);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd20);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd20);
  }
  else {
    int256_t::int256_t<int,void>(in_RDI,0);
    piVar11 = in_RDI;
  }
  return piVar11;
}

Assistant:

int256_t pi_lmo1(int128_t x)
{
  if (x < 2)
    return 0;

  int64_t y = iroot<3>(x); 
  int64_t pi_y = pi_legendre(y, 1);
  int64_t c = PhiTiny::get_c(y);
  int256_t S1 = 0;
  int256_t S2 = 0;

  vector<int32_t> primes = generate_primes(y);
  vector<int32_t> lpf = generate_lpf(y);
  vector<int32_t> mu = generate_moebius(y);

  // Calculate the contribution of the ordinary leaves
  for (int64_t n = 1; n <= y; n++)
    if (lpf[n] > primes[c])
      S1 += phi_sum(x / n, c) * (mu[n] * n);
  
  // Calculate the contribution of the special leaves
  for (int64_t b = c + 1; b < pi_y; b++)
    for (int128_t m = (y / primes[b]) + 1; m <= y; m++)
      if (lpf[m] > primes[b])
        S2 -= phi_sum(x / (primes[b] * m), b - 1) * (mu[m] * m * primes[b]);

  int256_t phi = S1 + S2;
  int256_t p2 = P2(x, y, 1);
  int256_t sum = phi + prime_sum_tiny(y) - 1 - p2;

  return sum;
}